

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O0

void __thiscall proto3_arena_unittest::TestPackedTypes::Clear(TestPackedTypes *this)

{
  uint32_t cached_has_bits;
  TestPackedTypes *this_local;
  
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_int32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.packed_int64_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&(this->field_0)._impl_.packed_uint32_);
  google::protobuf::RepeatedField<unsigned_long>::Clear(&(this->field_0)._impl_.packed_uint64_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_sint32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.packed_sint64_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&(this->field_0)._impl_.packed_fixed32_);
  google::protobuf::RepeatedField<unsigned_long>::Clear(&(this->field_0)._impl_.packed_fixed64_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_sfixed32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.packed_sfixed64_);
  google::protobuf::RepeatedField<float>::Clear(&(this->field_0)._impl_.packed_float_);
  google::protobuf::RepeatedField<double>::Clear(&(this->field_0)._impl_.packed_double_);
  google::protobuf::RepeatedField<bool>::Clear(&(this->field_0)._impl_.packed_bool_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_enum_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestPackedTypes::Clear() {
// @@protoc_insertion_point(message_clear_start:proto3_arena_unittest.TestPackedTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.packed_int32_.Clear();
  _impl_.packed_int64_.Clear();
  _impl_.packed_uint32_.Clear();
  _impl_.packed_uint64_.Clear();
  _impl_.packed_sint32_.Clear();
  _impl_.packed_sint64_.Clear();
  _impl_.packed_fixed32_.Clear();
  _impl_.packed_fixed64_.Clear();
  _impl_.packed_sfixed32_.Clear();
  _impl_.packed_sfixed64_.Clear();
  _impl_.packed_float_.Clear();
  _impl_.packed_double_.Clear();
  _impl_.packed_bool_.Clear();
  _impl_.packed_enum_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}